

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTest.cpp
# Opt level: O2

void __thiscall CardProdDiffInv::test_method(CardProdDiffInv *this)

{
  double *__ptr;
  Index IVar1;
  Index IVar2;
  bool bVar3;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar5;
  VectorXd x;
  double *local_840;
  Index local_838;
  shared_count sStack_830;
  void *local_828;
  Matrix<double,__1,__1,_0,__1,__1> local_818;
  VectorXd v;
  Scalar local_7e8;
  char *local_7e0;
  char *local_7d8;
  Scalar local_7d0;
  Scalar local_7c8;
  Scalar local_7c0;
  Scalar local_7b8;
  Scalar local_7b0;
  MatrixXd Jtest;
  Scalar local_790;
  Scalar local_788;
  Scalar local_780;
  Scalar local_778;
  Scalar local_770;
  Scalar local_768;
  Scalar local_760;
  Scalar local_758;
  Scalar local_750;
  Scalar local_748;
  Scalar local_740;
  Scalar local_738;
  Scalar local_730;
  Scalar local_728;
  Scalar local_720;
  Scalar local_718;
  Scalar local_710;
  Scalar local_708;
  Scalar local_700;
  Scalar local_6f8;
  Scalar local_6f0;
  Scalar local_6e8;
  Scalar local_6e0;
  Scalar local_6d8;
  Scalar local_6d0;
  Scalar local_6c8;
  Scalar local_6c0;
  Scalar local_6b8;
  Scalar local_6b0;
  Scalar local_6a8;
  Scalar local_6a0;
  Scalar local_698;
  Scalar local_690;
  Scalar local_688;
  Scalar local_680;
  Scalar local_678;
  Scalar local_670;
  Scalar local_668;
  Scalar local_660;
  Scalar local_658;
  Scalar local_650;
  Scalar local_648;
  Scalar local_640;
  Scalar local_638;
  Scalar local_630;
  Scalar local_628;
  Scalar local_620;
  Scalar local_618;
  Scalar local_610;
  Scalar local_608;
  Scalar local_600;
  Scalar local_5f8;
  Scalar local_5f0;
  Scalar local_5e8;
  Scalar local_5e0;
  Scalar local_5d8;
  Scalar local_5d0;
  Scalar local_5c8;
  Scalar local_5c0;
  Scalar local_5b8;
  Scalar local_5b0;
  Scalar local_5a8;
  Scalar local_5a0;
  Scalar local_598;
  Scalar local_590;
  Scalar local_588;
  Scalar local_580;
  Scalar local_578;
  Scalar local_570;
  Scalar local_568;
  Scalar local_560;
  Scalar local_558;
  Scalar local_550;
  Scalar local_548;
  Scalar local_540;
  Scalar local_538;
  Scalar local_530;
  Scalar local_528;
  Scalar local_520;
  Scalar local_518;
  Scalar local_510;
  Scalar local_508;
  Scalar local_500;
  Scalar local_4f8;
  Scalar local_4f0;
  Scalar local_4e8;
  Scalar local_4e0;
  Scalar local_4d8;
  Scalar local_4d0;
  Scalar local_4c8;
  Scalar local_4c0;
  Scalar local_4b8;
  Scalar local_4b0;
  Scalar local_4a8;
  Scalar local_4a0;
  Scalar local_498;
  Scalar local_490;
  Scalar local_488;
  Scalar local_480;
  Scalar local_478;
  Scalar local_470;
  Scalar local_468;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_460 [24];
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_448 [9];
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  CartesianProduct S;
  RealSpace R3;
  RealSpace R2;
  CartesianProduct R2SO3;
  SO3<mnf::ExpMapMatrix> RotSpace;
  
  mnf::RealSpace::RealSpace(&R2,2);
  mnf::RealSpace::RealSpace(&R3,3);
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&RotSpace);
  mnf::CartesianProduct::CartesianProduct(&R2SO3,(Manifold *)&R2,&RotSpace.super_Manifold);
  mnf::CartesianProduct::CartesianProduct(&S,(Manifold *)&R2SO3,(Manifold *)&R3);
  local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_448[0].m_xpr._0_4_ = 8;
  local_840 = (double *)CONCAT44(local_840._4_4_,0xe);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&Jtest,(int *)local_448,(int *)&local_840);
  local_840 = (double *)0x3ff0000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
            (local_448,&Jtest,(Scalar *)&local_840);
  x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (local_448,(Scalar *)&x);
  v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&v);
  local_7e0 = (char *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_7e0);
  local_7e8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_7e8);
  local_7b0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_7b0);
  local_7b8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_7b8);
  local_7c0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_7c0);
  local_7c8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_7c8);
  local_7d0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_7d0);
  local_468 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_468);
  local_470 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_470);
  local_478 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_478);
  local_480 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_480);
  local_488 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_488);
  local_490 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_490);
  local_498 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_498);
  local_4a0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4a0);
  local_4a8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4a8);
  local_4b0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4b0);
  local_4b8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4b8);
  local_4c0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4c0);
  local_4c8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4c8);
  local_4d0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4d0);
  local_4d8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4d8);
  local_4e0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4e0);
  local_4e8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4e8);
  local_4f0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4f0);
  local_4f8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4f8);
  local_500 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_500);
  local_508 = -0.064043491813865;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_508);
  local_510 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_510);
  local_518 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_518);
  local_520 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_520);
  local_528 = -0.064043491813865;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_528);
  local_530 = 0.545030346992499;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_530);
  local_538 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_538);
  local_540 = -0.545030346992499;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_540);
  local_548 = -0.064043491813865;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_548);
  local_550 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_550);
  local_558 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_558);
  local_560 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_560);
  local_568 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_568);
  local_570 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_570);
  local_578 = -0.110117993664377;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_578);
  local_580 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_580);
  local_588 = -0.545030346992499;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_588);
  local_590 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_590);
  local_598 = -0.110117993664377;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_598);
  local_5a0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5a0);
  local_5a8 = 0.545030346992499;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5a8);
  local_5b0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5b0);
  local_5b8 = -0.110117993664377;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5b8);
  local_5c0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5c0);
  local_5c8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5c8);
  local_5d0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5d0);
  local_5d8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5d8);
  local_5e0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5e0);
  local_5e8 = -0.042109988599266;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5e8);
  local_5f0 = 0.545030346992499;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5f0);
  local_5f8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5f8);
  local_600 = -0.545030346992499;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_600);
  local_608 = -0.042109988599266;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_608);
  local_610 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_610);
  local_618 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_618);
  local_620 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_620);
  local_628 = -0.042109988599266;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_628);
  local_630 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_630);
  local_638 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_638);
  local_640 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_640);
  local_648 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_648);
  local_650 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_650);
  local_658 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_658);
  local_660 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_660);
  local_668 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_668);
  local_670 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_670);
  local_678 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_678);
  local_680 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_680);
  local_688 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_688);
  local_690 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_690);
  local_698 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_698);
  local_6a0 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6a0);
  local_6a8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6a8);
  local_6b0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6b0);
  local_6b8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6b8);
  local_6c0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6c0);
  local_6c8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6c8);
  local_6d0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6d0);
  local_6d8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6d8);
  local_6e0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6e0);
  local_6e8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6e8);
  local_6f0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6f0);
  local_6f8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6f8);
  local_700 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_700);
  local_708 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_708);
  local_710 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_710);
  local_718 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_718);
  local_720 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_720);
  local_728 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_728);
  local_730 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_730);
  local_738 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_738);
  local_740 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_740);
  local_748 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_748);
  local_750 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_750);
  local_758 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_758);
  local_760 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_760);
  local_768 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_768);
  local_770 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_770);
  local_778 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_778);
  local_780 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_780);
  local_788 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_788);
  local_790 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar4,&local_790);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished(local_448);
  mnf::Manifold::getZero();
  mnf::SubPoint::value();
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&x,
             (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)&local_840);
  mnf::Point::~Point((Point *)local_448);
  local_448[0].m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)CONCAT44(local_448[0].m_xpr._4_4_,8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&v,(int *)local_448);
  local_840 = (double *)0x406e68c747471161;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_448,&v,
             (Scalar *)&local_840);
  local_7e0 = (char *)0xc141a82b9e65bea1;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_448,
                      (Scalar *)&local_7e0);
  local_7e8 = 0.3403857;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar5,&local_7e8);
  local_7b0 = 0.58526775;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar5,&local_7b0);
  local_7b8 = 0.223811;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar5,&local_7b8);
  local_7c0 = 3.08;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar5,&local_7c0);
  local_7c8 = 1e-08;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar5,&local_7c8);
  local_7d0 = 232.5;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar5,&local_7d0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_448);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_460,&x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(type *)0x0
            );
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)local_448,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_840,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&v,(type *)0x0);
  mnf::Manifold::retractation(&S,local_460,local_448,&local_840);
  free(local_828);
  free((void *)local_448[0].m_currentBlockRows);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)local_448,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  mnf::Manifold::diffPseudoLog0((Ref_conflict *)&local_840);
  IVar2 = local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  IVar1 = local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  __ptr = local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data;
  local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_840;
  local_840 = __ptr;
  local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_838;
  local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)sStack_830.pi_;
  local_838 = IVar1;
  sStack_830.pi_ = (sp_counted_base *)IVar2;
  free(__ptr);
  free((void *)local_448[0].m_currentBlockRows);
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_300,0x188);
  local_7e8 = 1e-12;
  bVar3 = Eigen::internal::
          isApprox_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
          ::run(&local_818,&Jtest,&local_7e8);
  local_840 = (double *)CONCAT71(local_840._1_7_,bVar3);
  local_838 = 0;
  sStack_830.pi_ = (sp_counted_base *)0x0;
  local_7e0 = "J.isApprox(Jtest)";
  local_7d8 = "";
  local_448[0].m_row._0_1_ = 0;
  local_448[0].m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)&PTR__lazy_ostream_00150be0;
  local_448[0].m_col = (Index)&boost::unit_test::lazy_ostream::inst;
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_318 = "";
  local_448[0].m_currentBlockRows = (Index)&local_7e0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_830);
  free(v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(Jtest.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  mnf::CartesianProduct::~CartesianProduct(&S);
  mnf::CartesianProduct::~CartesianProduct(&R2SO3);
  mnf::SO3<mnf::ExpMapMatrix>::~SO3(&RotSpace);
  mnf::RealSpace::~RealSpace(&R3);
  mnf::RealSpace::~RealSpace(&R2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(CardProdDiffInv)
{
  RealSpace R2(2);
  RealSpace R3(3);
  SO3<ExpMapMatrix> RotSpace;
  CartesianProduct R2SO3(R2, RotSpace);
  CartesianProduct S(R2SO3, R3);
  Eigen::MatrixXd J;
  Eigen::MatrixXd Jtest(8, 14);
  Jtest << 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, 0,
      0, 0, 0, 0, 0, 0, 0, -0.064043491813865, 0, 0, 0, -0.064043491813865,
      0.545030346992499, 0, -0.545030346992499, -0.064043491813865, 0, 0, 0, 0,
      0, -0.110117993664377, 0, -0.545030346992499, 0, -0.110117993664377, 0,
      0.545030346992499, 0, -0.110117993664377, 0, 0, 0, 0, 0,
      -0.042109988599266, 0.545030346992499, 0, -0.545030346992499,
      -0.042109988599266, 0, 0, 0, -0.042109988599266, 0, 0, 0, 0, 0, 0, 0, 0,
      0, 0, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1, 0, 0, 0,
      0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1;
  Eigen::VectorXd x = S.getZero().value();
  Eigen::VectorXd v(8);
  v << 243.27432598, -2314327.23748, 0.3403857, 0.58526775, 0.223811, 3.08,
      0.00000001, 232.5;
  S.retractation(x, x, v);
  J = S.diffPseudoLog0(x);
  BOOST_CHECK(J.isApprox(Jtest));
}